

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O1

StrT<char> * __thiscall tl::StrT<char>::operator=(StrT<char> *this,StrT<char> *o)

{
  char *pcVar1;
  
  pcVar1 = this->_str;
  if (pcVar1 != (char *)0x0 && pcVar1 != &s_emptyStr<char>) {
    operator_delete__(pcVar1);
  }
  this->_str = o->_str;
  this->_size = o->_size;
  o->_str = &s_emptyStr<char>;
  o->_size = 0;
  return this;
}

Assistant:

const StrT<CharT>& StrT<CharT>::operator=(StrT&& o)
{
    if(_str != s_emptyStr<CharT>)
        delete[] _str;
    stealMove(tl::move(o));
    return *this;
}